

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O3

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::resume_bfs
          (DynamicPartialIndex *this,vertex_t s,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  uint uVar1;
  pointer puVar2;
  vertex_t *pvVar3;
  pointer puVar4;
  pointer pvVar5;
  uint *puVar6;
  ulong uVar7;
  const_iterator cVar8;
  ulong uVar9;
  ulong uVar10;
  uint *nxt;
  uint *puVar11;
  ulong uVar12;
  ulong uVar13;
  uint local_3c;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_38;
  
  uVar12 = (ulong)s;
  this->back_ = 0;
  this->front_ = 0;
  puVar2 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar2;
  local_38 = graph;
  if (uVar12 < uVar10) {
    if (puVar2[uVar12] == '?') {
      __assert_fail("dist.at(s) != INF8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lebdron[P]dynamic-k-reach/index/DynamicScalableKReach.cpp"
                    ,10,
                    "void DynamicScalableKReach::DynamicPartialIndex::resume_bfs(vertex_t, const std::vector<std::vector<vertex_t>> &, std::vector<distance_t> &)"
                   );
    }
    this->back_ = 1;
    pvVar3 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_start;
    if ((this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish == pvVar3) {
      uVar10 = 0;
      uVar12 = 0;
    }
    else {
      *pvVar3 = s;
      uVar7 = 1;
      uVar12 = 0;
      while( true ) {
        uVar9 = uVar12 + 1;
        this->front_ = uVar9;
        puVar4 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar10 = (long)(this->queue_->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar4 >> 2;
        if (uVar10 <= uVar12) break;
        uVar13 = (ulong)puVar4[uVar12];
        puVar2 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
        uVar12 = uVar13;
        if (uVar10 <= uVar13) break;
        if (puVar2[uVar13] < this->k_) {
          pvVar5 = (local_38->
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar10 = ((long)(local_38->
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
                   -0x5555555555555555;
          if (uVar10 < uVar13 || uVar10 - uVar13 == 0) break;
          puVar11 = pvVar5[uVar13].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar6 = *(pointer *)
                    ((long)&pvVar5[uVar13].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data + 8);
          if (puVar11 != puVar6) {
            do {
              uVar7 = (ulong)*puVar11;
              puVar2 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              uVar10 = (long)(dist->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
              uVar12 = uVar7;
              if ((uVar10 <= uVar7) || (uVar12 = uVar13, uVar10 <= uVar13)) goto LAB_001094ad;
              if (puVar2[uVar13] + 1 < (uint)puVar2[uVar7]) {
                puVar2[uVar7] = puVar2[uVar13] + 1;
                if (this->isD2_ == true) {
                  local_3c = *puVar11;
                  cVar8 = std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::find(&(this->parent_->D1_).succ_._M_h,&local_3c);
                  if (cVar8.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                      ._M_cur != (__node_type *)0x0) goto LAB_00109464;
                }
                uVar1 = *puVar11;
                uVar12 = this->back_;
                this->back_ = uVar12 + 1;
                puVar4 = (this->queue_->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                uVar10 = (long)(this->queue_->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2;
                if (uVar10 <= uVar12) goto LAB_001094ad;
                puVar4[uVar12] = uVar1;
              }
LAB_00109464:
              puVar11 = puVar11 + 1;
            } while (puVar11 != puVar6);
            uVar7 = this->back_;
            uVar9 = this->front_;
          }
        }
        uVar12 = uVar9;
        if (uVar7 == uVar9) {
          return;
        }
      }
    }
  }
LAB_001094ad:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar12,
             uVar10);
}

Assistant:

void DynamicScalableKReach::DynamicPartialIndex::resume_bfs(vertex_t s, const std::vector<std::vector<vertex_t>> &graph,
                                                            std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    assert(dist.at(s) != INF8);
    queue_.at(back_++) = s;
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        if (dist.at(cur) >= k_) {
            continue;
        }
        for (const auto &nxt : graph.at(cur)) {
            if (dist.at(nxt) <= dist.at(cur) + 1) {
                continue;
            }
            dist.at(nxt) = dist.at(cur) + 1;
            if (!isD2_ || !parent_.D1_.indexed(nxt)) {
                queue_.at(back_++) = nxt;
            }
        }
    }
}